

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O0

void __thiscall IZDeflate::set_file_type(IZDeflate *this)

{
  int local_1c;
  ulong uStack_18;
  int n;
  unsigned_long mask;
  IZDeflate *this_local;
  
  uStack_18 = 0xf3ffc07f;
  local_1c = 0;
  while( true ) {
    if (0x1f < local_1c) {
      *this->file_type = 1;
      if (((this->dyn_ltree[9].fc.freq == 0) && (this->dyn_ltree[10].fc.freq == 0)) &&
         (this->dyn_ltree[0xd].fc.freq == 0)) {
        for (local_1c = 0x20; local_1c < 0x100; local_1c = local_1c + 1) {
          if (this->dyn_ltree[local_1c].fc.freq != 0) {
            return;
          }
        }
        *this->file_type = 0;
      }
      return;
    }
    if (((uStack_18 & 1) != 0) && (this->dyn_ltree[local_1c].fc.freq != 0)) break;
    local_1c = local_1c + 1;
    uStack_18 = uStack_18 >> 1;
  }
  *this->file_type = 0;
  return;
}

Assistant:

void IZDeflate::set_file_type()
{
    /* bit-mask of black-listed bytes
     * bit is set if byte is black-listed
     * set bits 0..6, 14..25, and 28..31
     * 0xf3ffc07f = binary 11110011111111111100000001111111
     */
    unsigned long mask = 0xf3ffc07fL;
    int n;

    /* Check for non-textual ("black-listed") bytes. */
    for (n = 0; n <= 31; n++, mask >>= 1)
        if ((mask & 1) && (dyn_ltree[n].Freq != 0))
        {
            *file_type = BINARY;
            return;
        }

    /* Check for textual ("white-listed") bytes. */
    *file_type = ASCII;
    if (dyn_ltree[9].Freq != 0 || dyn_ltree[10].Freq != 0
            || dyn_ltree[13].Freq != 0)
        return;
    for (n = 32; n < LITERALS; n++)
        if (dyn_ltree[n].Freq != 0)
            return;

    /* This deflate stream is either empty, or
     * it has tolerated ("gray-listed") bytes only.
     */
    *file_type = BINARY;
}